

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  ImGuiPayload *this;
  ImGuiID IVar1;
  ImGuiID IVar2;
  uint uVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiPayload *pIVar6;
  float fVar7;
  ImRect r;
  ImRect local_38;
  
  pIVar4 = GImGui;
  this = &GImGui->DragDropPayload;
  if ((type != (char *)0x0) && (bVar5 = ImGuiPayload::IsDataType(this,type), !bVar5)) {
    return (ImGuiPayload *)0x0;
  }
  IVar1 = pIVar4->DragDropTargetId;
  IVar2 = pIVar4->DragDropAcceptIdPrev;
  local_38.Min = (pIVar4->DragDropTargetRect).Min;
  local_38.Max = (pIVar4->DragDropTargetRect).Max;
  fVar7 = (local_38.Max.y - local_38.Min.y) * (local_38.Max.x - local_38.Min.x);
  if (pIVar4->DragDropAcceptIdCurrRectSurface <= fVar7 &&
      fVar7 != pIVar4->DragDropAcceptIdCurrRectSurface) {
    return (ImGuiPayload *)0x0;
  }
  pIVar4->DragDropAcceptFlags = flags;
  pIVar4->DragDropAcceptIdCurr = IVar1;
  pIVar4->DragDropAcceptIdCurrRectSurface = fVar7;
  (pIVar4->DragDropPayload).Preview = IVar2 == IVar1;
  uVar3 = pIVar4->DragDropSourceFlags;
  if (((uVar3 | flags) >> 0xb & 1) == 0 && IVar2 == IVar1) {
    RenderDragDropTargetRect(&local_38,&pIVar4->DragDropTargetClipRect);
    uVar3 = pIVar4->DragDropSourceFlags;
  }
  pIVar4->DragDropAcceptFrameCount = pIVar4->FrameCount;
  if (((uVar3 & 0x10) == 0) || (pIVar4->DragDropMouseButton != -1)) {
    if (IVar2 == IVar1) {
      bVar5 = IsMouseDown(pIVar4->DragDropMouseButton);
      bVar5 = !bVar5;
      goto LAB_0016864c;
    }
  }
  else if (IVar2 == IVar1) {
    bVar5 = pIVar4->DragDropSourceFrameCount < pIVar4->FrameCount;
    goto LAB_0016864c;
  }
  bVar5 = false;
LAB_0016864c:
  pIVar6 = (ImGuiPayload *)0x0;
  if (bVar5 != false) {
    pIVar6 = this;
  }
  if ((flags & 0x400U) != 0) {
    pIVar6 = this;
  }
  (pIVar4->DragDropPayload).Delivery = bVar5;
  if (bVar5 != false) {
    if ((pIVar4->DebugLogFlags & 1) != 0) {
      DebugLog("[dragdrop] AcceptDragDropPayload(): 0x%08X: payload delivery\n",
               (ulong)pIVar4->DragDropTargetId);
      return this;
    }
    return this;
  }
  return pIVar6;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface > g.DragDropAcceptIdCurrRectSurface)
        return NULL;

    g.DragDropAcceptFlags = flags;
    g.DragDropAcceptIdCurr = g.DragDropTargetId;
    g.DragDropAcceptIdCurrRectSurface = r_surface;
    //IMGUI_DEBUG_LOG("AcceptDragDropPayload(): %08X: accept\n", g.DragDropTargetId);

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that live for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
        RenderDragDropTargetRect(r, g.DragDropTargetClipRect);

    g.DragDropAcceptFrameCount = g.FrameCount;
    if ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) && g.DragDropMouseButton == -1)
        payload.Delivery = was_accepted_previously && (g.DragDropSourceFrameCount < g.FrameCount);
    else
        payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting OS window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    if (payload.Delivery)
        IMGUI_DEBUG_LOG_ACTIVEID("[dragdrop] AcceptDragDropPayload(): 0x%08X: payload delivery\n", g.DragDropTargetId);
    return &payload;
}